

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O0

int get_http_header_len(char *buf,int buflen)

{
  byte bVar1;
  ushort **ppuVar2;
  int local_20;
  uchar c;
  int i;
  int buflen_local;
  char *buf_local;
  
  local_20 = 0;
  while( true ) {
    if (buflen <= local_20) {
      return 0;
    }
    bVar1 = buf[local_20];
    if ((((bVar1 < 0x80) && (bVar1 != 0xd)) && (bVar1 != 10)) &&
       (ppuVar2 = __ctype_b_loc(), ((*ppuVar2)[(int)(uint)bVar1] & 0x4000) == 0)) {
      return -1;
    }
    if (((local_20 < buflen + -1) && (buf[local_20] == '\n')) && (buf[local_20 + 1] == '\n')) {
      return local_20 + 2;
    }
    if (((local_20 < buflen + -3) && (buf[local_20] == '\r')) &&
       ((buf[local_20 + 1] == '\n' && ((buf[local_20 + 2] == '\r' && (buf[local_20 + 3] == '\n')))))
       ) break;
    local_20 = local_20 + 1;
  }
  return local_20 + 4;
}

Assistant:

static int
get_http_header_len(const char *buf, int buflen)
{
	int i;
	for (i = 0; i < buflen; i++) {
		/* Do an unsigned comparison in some conditions below */
		const unsigned char c = (unsigned char)buf[i];

		if ((c < 128) && ((char)c != '\r') && ((char)c != '\n')
		    && !isprint(c)) {
			/* abort scan as soon as one malformed character is found */
			return -1;
		}

		if (i < buflen - 1) {
			if ((buf[i] == '\n') && (buf[i + 1] == '\n')) {
				/* Two newline, no carriage return - not standard compliant,
				 * but it should be accepted */
				return i + 2;
			}
		}

		if (i < buflen - 3) {
			if ((buf[i] == '\r') && (buf[i + 1] == '\n') && (buf[i + 2] == '\r')
			    && (buf[i + 3] == '\n')) {
				/* Two \r\n - standard compliant */
				return i + 4;
			}
		}
	}

	return 0;
}